

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O0

void __thiscall
HighsLinearSumBounds::updatedVarUpper
          (HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient,
          double oldVarUpper)

{
  double dVar1;
  double *pdVar2;
  reference pvVar3;
  int in_EDX;
  int in_ESI;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_RDI;
  double in_XMM0_Qa;
  HighsCDouble *this_00;
  double in_XMM1_Qa;
  double vUpper;
  double oldVUpper;
  double in_stack_ffffffffffffff78;
  HighsCDouble *in_stack_ffffffffffffff80;
  double in_stack_ffffffffffffff88;
  HighsCDouble *in_stack_ffffffffffffff90;
  double local_48;
  double local_40;
  double local_20;
  double local_18;
  int local_10;
  int local_c;
  
  local_40 = in_XMM1_Qa;
  local_20 = in_XMM1_Qa;
  local_18 = in_XMM0_Qa;
  local_10 = in_EDX;
  local_c = in_ESI;
  if (*(int *)((long)&(in_RDI[9].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage)->hi + (long)in_EDX * 4) !=
      in_ESI) {
    pdVar2 = std::min<double>(&(in_RDI[9].
                                super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                _M_impl.super__Vector_impl_data._M_start)->hi + in_EDX,&local_20);
    local_40 = *pdVar2;
  }
  if (*(int *)((long)&(in_RDI[9].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage)->hi + (long)local_10 * 4)
      == local_c) {
    local_48 = (&(in_RDI[8].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                  super__Vector_impl_data._M_finish)->hi)[local_10];
  }
  else {
    pdVar2 = std::min<double>(&(in_RDI[9].
                                super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                _M_impl.super__Vector_impl_data._M_start)->hi + local_10,
                              &(in_RDI[8].
                                super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                _M_impl.super__Vector_impl_data._M_finish)->hi + local_10);
    local_48 = *pdVar2;
  }
  if (local_18 <= 0.0) {
    if ((local_48 != local_40) || (NAN(local_48) || NAN(local_40))) {
      if ((local_40 != INFINITY) || (NAN(local_40))) {
        in_stack_ffffffffffffff90 = (HighsCDouble *)(local_40 * local_18);
        std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                  (in_RDI + 4,(long)local_c);
        HighsCDouble::operator-=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
      else {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)local_c);
        *pvVar3 = *pvVar3 + -1;
      }
      if ((local_48 != INFINITY) || (NAN(local_48))) {
        in_stack_ffffffffffffff88 = local_48 * local_18;
        std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                  (in_RDI + 4,(long)local_c);
        HighsCDouble::operator+=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
      else {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)local_c);
        *pvVar3 = *pvVar3 + 1;
      }
    }
    if ((local_20 != INFINITY) || (NAN(local_20))) {
      this_00 = (HighsCDouble *)(local_20 * local_18);
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](in_RDI,(long)local_c);
      HighsCDouble::operator-=(this_00,in_stack_ffffffffffffff78);
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_c);
      *pvVar3 = *pvVar3 + -1;
    }
    dVar1 = (&(in_RDI[8].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
               super__Vector_impl_data._M_finish)->hi)[local_10];
    if ((dVar1 != INFINITY) || (NAN(dVar1))) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](in_RDI,(long)local_c);
      HighsCDouble::operator+=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_c);
      *pvVar3 = *pvVar3 + 1;
    }
  }
  else {
    if ((local_48 != local_40) || (NAN(local_48) || NAN(local_40))) {
      if ((local_40 != INFINITY) || (NAN(local_40))) {
        std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                  (in_RDI + 5,(long)local_c);
        HighsCDouble::operator-=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
      else {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 7),(long)local_c);
        *pvVar3 = *pvVar3 + -1;
      }
      if ((local_48 != INFINITY) || (NAN(local_48))) {
        std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                  (in_RDI + 5,(long)local_c);
        HighsCDouble::operator+=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
      else {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 7),(long)local_c);
        *pvVar3 = *pvVar3 + 1;
      }
    }
    if ((local_20 != INFINITY) || (NAN(local_20))) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](in_RDI + 1,(long)local_c)
      ;
      HighsCDouble::operator-=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 3),(long)local_c);
      *pvVar3 = *pvVar3 + -1;
    }
    dVar1 = (&(in_RDI[8].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
               super__Vector_impl_data._M_finish)->hi)[local_10];
    if ((dVar1 != INFINITY) || (NAN(dVar1))) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](in_RDI + 1,(long)local_c)
      ;
      HighsCDouble::operator+=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 3),(long)local_c);
      *pvVar3 = *pvVar3 + 1;
    }
  }
  return;
}

Assistant:

void HighsLinearSumBounds::updatedVarUpper(HighsInt sum, HighsInt var,
                                           double coefficient,
                                           double oldVarUpper) {
  double oldVUpper = implVarUpperSource[var] == sum
                         ? oldVarUpper
                         : std::min(implVarUpper[var], oldVarUpper);

  double vUpper = implVarUpperSource[var] == sum
                      ? varUpper[var]
                      : std::min(implVarUpper[var], varUpper[var]);

  if (coefficient > 0) {
    if (vUpper != oldVUpper) {
      if (oldVUpper == kHighsInf)
        numInfSumUpper[sum] -= 1;
      else
        sumUpper[sum] -= oldVUpper * coefficient;

      if (vUpper == kHighsInf)
        numInfSumUpper[sum] += 1;
      else
        sumUpper[sum] += vUpper * coefficient;
    }
    if (oldVarUpper == kHighsInf)
      numInfSumUpperOrig[sum] -= 1;
    else
      sumUpperOrig[sum] -= oldVarUpper * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumUpperOrig[sum] += 1;
    else
      sumUpperOrig[sum] += varUpper[var] * coefficient;
  } else {
    if (vUpper != oldVUpper) {
      if (oldVUpper == kHighsInf)
        numInfSumLower[sum] -= 1;
      else
        sumLower[sum] -= oldVUpper * coefficient;

      if (vUpper == kHighsInf)
        numInfSumLower[sum] += 1;
      else
        sumLower[sum] += vUpper * coefficient;
    }
    if (oldVarUpper == kHighsInf)
      numInfSumLowerOrig[sum] -= 1;
    else
      sumLowerOrig[sum] -= oldVarUpper * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumLowerOrig[sum] += 1;
    else
      sumLowerOrig[sum] += varUpper[var] * coefficient;
  }
}